

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall jbcoin::STAmount::canonicalize(STAmount *this)

{
  bool bVar1;
  STAmount *this_local;
  
  bVar1 = isXRP(this);
  if (bVar1) {
    this->mIsNative = true;
    if (this->mValue == 0) {
      this->mOffset = 0;
      this->mIsNegative = false;
    }
    else {
      while (this->mOffset < 0) {
        this->mValue = this->mValue / 10;
        this->mOffset = this->mOffset + 1;
      }
      while (0 < this->mOffset) {
        this->mValue = this->mValue * 10;
        this->mOffset = this->mOffset + -1;
      }
      if (100000000000000000 < this->mValue) {
        Throw<std::runtime_error,char_const(&)[36]>
                  ((char (*) [36])"Native currency amount out of range");
      }
    }
  }
  else {
    this->mIsNative = false;
    if (this->mValue == 0) {
      this->mOffset = -100;
      this->mIsNegative = false;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (this->mValue < 1000000000000000) {
          bVar1 = -0x60 < this->mOffset;
        }
        if (!bVar1) break;
        this->mValue = this->mValue * 10;
        this->mOffset = this->mOffset + -1;
      }
      while (9999999999999999 < this->mValue) {
        if (0x4f < this->mOffset) {
          Throw<std::runtime_error,char_const(&)[15]>((char (*) [15])0x468944);
        }
        this->mValue = this->mValue / 10;
        this->mOffset = this->mOffset + 1;
      }
      if ((this->mOffset < -0x60) || (this->mValue < 1000000000000000)) {
        this->mValue = 0;
        this->mIsNegative = false;
        this->mOffset = -100;
      }
      else {
        if (0x50 < this->mOffset) {
          Throw<std::runtime_error,char_const(&)[15]>((char (*) [15])0x468944);
        }
        bVar1 = true;
        if ((this->mValue != 0) && (bVar1 = false, 999999999999999 < this->mValue)) {
          bVar1 = this->mValue < 10000000000000000;
        }
        if (!bVar1) {
          __assert_fail("(mValue == 0) || ((mValue >= cMinValue) && (mValue <= cMaxValue))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STAmount.cpp"
                        ,700,"void jbcoin::STAmount::canonicalize()");
        }
        bVar1 = true;
        if ((this->mValue != 0) && (bVar1 = false, -0x61 < this->mOffset)) {
          bVar1 = this->mOffset < 0x51;
        }
        if (!bVar1) {
          __assert_fail("(mValue == 0) || ((mOffset >= cMinOffset) && (mOffset <= cMaxOffset))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STAmount.cpp"
                        ,0x2bd,"void jbcoin::STAmount::canonicalize()");
        }
        bVar1 = true;
        if (this->mValue == 0) {
          bVar1 = this->mOffset != -100;
        }
        if (!bVar1) {
          __assert_fail("(mValue != 0) || (mOffset != -100)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STAmount.cpp"
                        ,0x2be,"void jbcoin::STAmount::canonicalize()");
        }
      }
    }
  }
  return;
}

Assistant:

void STAmount::canonicalize ()
{
    if (isXRP (*this))
    {
        // native currency amounts should always have an offset of zero
        mIsNative = true;

        if (mValue == 0)
        {
            mOffset = 0;
            mIsNegative = false;
            return;
        }

        while (mOffset < 0)
        {
            mValue /= 10;
            ++mOffset;
        }

        while (mOffset > 0)
        {
            mValue *= 10;
            --mOffset;
        }

        if (mValue > cMaxNativeN)
            Throw<std::runtime_error> ("Native currency amount out of range");

        return;
    }

    mIsNative = false;

    if (mValue == 0)
    {
        mOffset = -100;
        mIsNegative = false;
        return;
    }

    while ((mValue < cMinValue) && (mOffset > cMinOffset))
    {
        mValue *= 10;
        --mOffset;
    }

    while (mValue > cMaxValue)
    {
        if (mOffset >= cMaxOffset)
            Throw<std::runtime_error> ("value overflow");

        mValue /= 10;
        ++mOffset;
    }

    if ((mOffset < cMinOffset) || (mValue < cMinValue))
    {
        mValue = 0;
        mIsNegative = false;
        mOffset = -100;
        return;
    }

    if (mOffset > cMaxOffset)
        Throw<std::runtime_error> ("value overflow");

    assert ((mValue == 0) || ((mValue >= cMinValue) && (mValue <= cMaxValue)));
    assert ((mValue == 0) || ((mOffset >= cMinOffset) && (mOffset <= cMaxOffset)));
    assert ((mValue != 0) || (mOffset != -100));
}